

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int ssl_hs_is_proper_fragment(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uint uVar2;
  
  uVar2 = 1;
  if ((ssl->in_hslen <= ssl->in_msglen) &&
     (puVar1 = ssl->in_msg, uVar2 = 1, puVar1[8] == '\0' && *(short *)(puVar1 + 6) == 0)) {
    uVar2 = (uint)(puVar1[0xb] != puVar1[3] || *(short *)(puVar1 + 9) != *(short *)(puVar1 + 1));
  }
  return uVar2;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_hs_is_proper_fragment(mbedtls_ssl_context *ssl)
{
    if (ssl->in_msglen < ssl->in_hslen ||
        memcmp(ssl->in_msg + 6, "\0\0\0",        3) != 0 ||
        memcmp(ssl->in_msg + 9, ssl->in_msg + 1, 3) != 0) {
        return 1;
    }
    return 0;
}